

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O1

void __thiscall
USBAnalyzerResults::USBAnalyzerResults
          (USBAnalyzerResults *this,USBAnalyzer *analyzer,USBAnalyzerSettings *settings)

{
  _Rb_tree_header *p_Var1;
  
  AnalyzerResults::AnalyzerResults(&this->super_AnalyzerResults);
  *(undefined ***)this = &PTR__USBAnalyzerResults_0015a5a8;
  this->mSettings = settings;
  this->mAnalyzer = analyzer;
  p_Var1 = &(this->mAllStringDescriptors)._M_t._M_impl.super__Rb_tree_header;
  (this->mAllStringDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mAllStringDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mAllStringDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mAllStringDescriptors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mAllStringDescriptors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

USBAnalyzerResults::USBAnalyzerResults( USBAnalyzer* analyzer, USBAnalyzerSettings* settings )
    : mSettings( settings ), mAnalyzer( analyzer )
{
}